

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

void filemgr_set_rollback(filemgr *file,uint8_t new_val)

{
  char in_SIL;
  long in_RDI;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  if (in_SIL == '\0') {
    *(byte *)(in_RDI + 0xc) = *(byte *)(in_RDI + 0xc) & 0xfb;
  }
  else {
    *(byte *)(in_RDI + 0xc) = *(byte *)(in_RDI + 0xc) | 4;
  }
  pthread_spin_unlock((pthread_spinlock_t *)(in_RDI + 0x1a0));
  return;
}

Assistant:

void filemgr_set_rollback(struct filemgr *file, uint8_t new_val)
{
    spin_lock(&file->lock);
    if (new_val) {
        file->fflags |= FILEMGR_ROLLBACK_IN_PROG;
    } else {
        file->fflags &= ~FILEMGR_ROLLBACK_IN_PROG;
    }
    spin_unlock(&file->lock);
}